

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_object.cpp
# Opt level: O1

global_object_create_result *
mjs::make_object_object
          (global_object_create_result *__return_storage_ptr__,
          gc_heap_ptr<mjs::global_object> *global)

{
  undefined8 uVar1;
  long *plVar2;
  function_object *pfVar3;
  void *pvVar4;
  long *plVar5;
  gc_heap_ptr<mjs::function_object> o_1;
  gc_heap_ptr<mjs::gc_function> p_1;
  gc_heap_ptr<mjs::gc_function> p;
  gc_heap_ptr<mjs::function_object> o;
  object_ptr prototype;
  undefined1 local_f0 [16];
  gc_heap_ptr_untyped local_e0;
  undefined1 local_d0 [24];
  uint32_t local_b8;
  gc_heap_ptr_untyped local_b0;
  gc_heap_ptr_untyped local_a0;
  gc_heap_ptr_untyped local_90;
  undefined1 local_80 [8];
  anon_union_32_5_7b1e0779_for_value_3 local_78;
  gc_heap_ptr_untyped local_58;
  string_view local_48;
  gc_heap_ptr_untyped local_38;
  
  plVar2 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  (**(code **)(*plVar2 + 0x58))(&local_38,plVar2);
  local_d0._16_8_ = (global->super_gc_heap_ptr_untyped).heap_;
  local_b8 = (global->super_gc_heap_ptr_untyped).pos_;
  if ((slot *)local_d0._16_8_ != (slot *)0x0) {
    gc_heap::attach((gc_heap *)local_d0._16_8_,(gc_heap_ptr_untyped *)(local_d0 + 0x10));
  }
  gc_heap_ptr_untyped::get(&local_38);
  object::class_name((object *)local_f0);
  make_raw_function((mjs *)&local_58,global);
  pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_58);
  local_d0._0_8_ = (gc_heap *)0x0;
  local_d0._8_4_ = 0;
  gc_heap::allocate_and_construct<mjs::gc_function>
            ((gc_heap *)local_80,(size_t)(pfVar3->super_native_object).super_object.heap_);
  pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_80);
  *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001d49a8;
  *(undefined8 *)((long)pvVar4 + 0x10) = local_d0._16_8_;
  *(uint32_t *)((long)pvVar4 + 0x18) = local_b8;
  if ((slot *)local_d0._16_8_ != (slot *)0x0) {
    gc_heap::attach((gc_heap *)local_d0._16_8_,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x10));
  }
  function_object::put_function
            (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_80,
             (gc_heap_ptr<mjs::gc_string> *)local_f0,(gc_heap_ptr<mjs::gc_string> *)local_d0,1);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_80);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_d0);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f0);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_d0 + 0x10));
  pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_58);
  function_object::default_construct_function(pfVar3);
  plVar2 = (long *)gc_heap_ptr_untyped::get(&local_38);
  plVar5 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  (**(code **)(*plVar5 + 0x98))(local_d0,plVar5,"constructor");
  local_d0._16_8_ = local_58.heap_;
  local_b8 = local_58.pos_;
  if ((slot *)local_58.heap_ != (slot *)0x0) {
    gc_heap::attach(local_58.heap_,(gc_heap_ptr_untyped *)(local_d0 + 0x10));
  }
  local_80._0_4_ = object;
  local_78.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
       (gc_heap *)local_d0._16_8_;
  local_78.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_b8;
  if ((slot *)local_d0._16_8_ != (slot *)0x0) {
    gc_heap::attach((gc_heap *)local_d0._16_8_,(gc_heap_ptr_untyped *)(local_80 + 8));
  }
  (**(code **)(*plVar2 + 8))(plVar2,local_d0,local_80,2);
  value::destroy((value *)local_80);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_d0 + 0x10));
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_d0);
  pvVar4 = gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  uVar1 = *(undefined8 *)((long)pvVar4 + 8);
  local_48._M_len = 8;
  local_48._M_str = "toString";
  string::string((string *)&local_b0,(global->super_gc_heap_ptr_untyped).heap_,&local_48);
  plVar2 = (long *)gc_heap_ptr_untyped::get(&local_38);
  make_raw_function((mjs *)&local_e0,global);
  pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_e0);
  local_d0._16_8_ = (slot *)0x0;
  local_b8 = 0;
  gc_heap::allocate_and_construct<mjs::gc_function>
            ((gc_heap *)local_d0,(size_t)(pfVar3->super_native_object).super_object.heap_);
  pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_d0);
  *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001d49e8;
  *(undefined8 *)((long)pvVar4 + 0x10) = uVar1;
  function_object::put_function
            (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_d0,
             (gc_heap_ptr<mjs::gc_string> *)&local_b0,
             (gc_heap_ptr<mjs::gc_string> *)(local_d0 + 0x10),0);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_d0);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_d0 + 0x10));
  local_f0._0_8_ = local_e0.heap_;
  local_f0._8_4_ = local_e0.pos_;
  if (local_e0.heap_ != (gc_heap *)0x0) {
    gc_heap::attach(local_e0.heap_,(gc_heap_ptr_untyped *)local_f0);
  }
  local_80._0_4_ = object;
  local_78.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
       (gc_heap *)local_f0._0_8_;
  local_78.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_f0._8_4_;
  if ((gc_heap *)local_f0._0_8_ != (gc_heap *)0x0) {
    gc_heap::attach((gc_heap *)local_f0._0_8_,(gc_heap_ptr_untyped *)(local_80 + 8));
  }
  (**(code **)(*plVar2 + 8))(plVar2,&local_b0,local_80,2);
  value::destroy((value *)local_80);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f0);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_e0);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_b0);
  local_48._M_len = 7;
  local_48._M_str = "valueOf";
  string::string((string *)&local_b0,(global->super_gc_heap_ptr_untyped).heap_,&local_48);
  plVar2 = (long *)gc_heap_ptr_untyped::get(&local_38);
  make_raw_function((mjs *)&local_e0,global);
  pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_e0);
  local_d0._16_8_ = (slot *)0x0;
  local_b8 = 0;
  gc_heap::allocate_and_construct<mjs::gc_function>
            ((gc_heap *)local_d0,(size_t)(pfVar3->super_native_object).super_object.heap_);
  pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_d0);
  *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001d4a28;
  function_object::put_function
            (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_d0,
             (gc_heap_ptr<mjs::gc_string> *)&local_b0,
             (gc_heap_ptr<mjs::gc_string> *)(local_d0 + 0x10),0);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_d0);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_d0 + 0x10));
  local_f0._0_8_ = local_e0.heap_;
  local_f0._8_4_ = local_e0.pos_;
  if (local_e0.heap_ != (gc_heap *)0x0) {
    gc_heap::attach(local_e0.heap_,(gc_heap_ptr_untyped *)local_f0);
  }
  local_80._0_4_ = object;
  local_78.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
       (gc_heap *)local_f0._0_8_;
  local_78.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_f0._8_4_;
  if ((gc_heap *)local_f0._0_8_ != (gc_heap *)0x0) {
    gc_heap::attach((gc_heap *)local_f0._0_8_,(gc_heap_ptr_untyped *)(local_80 + 8));
  }
  (**(code **)(*plVar2 + 8))(plVar2,&local_b0,local_80,2);
  value::destroy((value *)local_80);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f0);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_e0);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_b0);
  pvVar4 = gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  if (0 < *(int *)((long)pvVar4 + 0x20)) {
    local_90.heap_ = (global->super_gc_heap_ptr_untyped).heap_;
    local_90.pos_ = (global->super_gc_heap_ptr_untyped).pos_;
    if (local_90.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_90.heap_,&local_90);
    }
    local_48._M_len = 0xe;
    local_48._M_str = "toLocaleString";
    string::string((string *)&local_b0,(global->super_gc_heap_ptr_untyped).heap_,&local_48);
    plVar2 = (long *)gc_heap_ptr_untyped::get(&local_38);
    make_raw_function((mjs *)&local_e0,global);
    pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_e0);
    local_d0._16_8_ = (slot *)0x0;
    local_b8 = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_d0,(size_t)(pfVar3->super_native_object).super_object.heap_);
    pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_d0);
    *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001d4a68;
    *(gc_heap **)((long)pvVar4 + 0x10) = local_90.heap_;
    *(uint32_t *)((long)pvVar4 + 0x18) = local_90.pos_;
    if (local_90.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_90.heap_,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x10));
    }
    function_object::put_function
              (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_d0,
               (gc_heap_ptr<mjs::gc_string> *)&local_b0,
               (gc_heap_ptr<mjs::gc_string> *)(local_d0 + 0x10),0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_d0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_d0 + 0x10));
    local_f0._0_8_ = local_e0.heap_;
    local_f0._8_4_ = local_e0.pos_;
    if (local_e0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_e0.heap_,(gc_heap_ptr_untyped *)local_f0);
    }
    local_80._0_4_ = object;
    local_78.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
         (gc_heap *)local_f0._0_8_;
    local_78.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_f0._8_4_;
    if ((gc_heap *)local_f0._0_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_f0._0_8_,(gc_heap_ptr_untyped *)(local_80 + 8));
    }
    (**(code **)(*plVar2 + 8))(plVar2,&local_b0,local_80,2);
    value::destroy((value *)local_80);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_e0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_b0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_90);
    local_90.heap_ = (global->super_gc_heap_ptr_untyped).heap_;
    local_90.pos_ = (global->super_gc_heap_ptr_untyped).pos_;
    if (local_90.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_90.heap_,&local_90);
    }
    local_48._M_len = 0xe;
    local_48._M_str = "hasOwnProperty";
    string::string((string *)&local_b0,(global->super_gc_heap_ptr_untyped).heap_,&local_48);
    plVar2 = (long *)gc_heap_ptr_untyped::get(&local_38);
    make_raw_function((mjs *)&local_e0,global);
    pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_e0);
    local_d0._16_8_ = (slot *)0x0;
    local_b8 = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_d0,(size_t)(pfVar3->super_native_object).super_object.heap_);
    pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_d0);
    *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001d4aa8;
    *(gc_heap **)((long)pvVar4 + 0x10) = local_90.heap_;
    *(uint32_t *)((long)pvVar4 + 0x18) = local_90.pos_;
    if (local_90.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_90.heap_,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x10));
    }
    function_object::put_function
              (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_d0,
               (gc_heap_ptr<mjs::gc_string> *)&local_b0,
               (gc_heap_ptr<mjs::gc_string> *)(local_d0 + 0x10),1);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_d0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_d0 + 0x10));
    local_f0._0_8_ = local_e0.heap_;
    local_f0._8_4_ = local_e0.pos_;
    if (local_e0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_e0.heap_,(gc_heap_ptr_untyped *)local_f0);
    }
    local_80._0_4_ = object;
    local_78.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
         (gc_heap *)local_f0._0_8_;
    local_78.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_f0._8_4_;
    if ((gc_heap *)local_f0._0_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_f0._0_8_,(gc_heap_ptr_untyped *)(local_80 + 8));
    }
    (**(code **)(*plVar2 + 8))(plVar2,&local_b0,local_80,2);
    value::destroy((value *)local_80);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_e0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_b0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_90);
    local_90.heap_ = (global->super_gc_heap_ptr_untyped).heap_;
    local_90.pos_ = (global->super_gc_heap_ptr_untyped).pos_;
    if ((slot *)local_90.heap_ != (slot *)0x0) {
      gc_heap::attach(local_90.heap_,&local_90);
    }
    local_48._M_len = 0x14;
    local_48._M_str = "propertyIsEnumerable";
    string::string((string *)&local_b0,(global->super_gc_heap_ptr_untyped).heap_,&local_48);
    plVar2 = (long *)gc_heap_ptr_untyped::get(&local_38);
    make_raw_function((mjs *)&local_e0,global);
    pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_e0);
    local_d0._16_8_ = (slot *)0x0;
    local_b8 = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_d0,(size_t)(pfVar3->super_native_object).super_object.heap_);
    pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_d0);
    *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001d4ae8;
    *(gc_heap **)((long)pvVar4 + 0x10) = local_90.heap_;
    *(uint32_t *)((long)pvVar4 + 0x18) = local_90.pos_;
    if ((slot *)local_90.heap_ != (slot *)0x0) {
      gc_heap::attach(local_90.heap_,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x10));
    }
    function_object::put_function
              (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_d0,
               (gc_heap_ptr<mjs::gc_string> *)&local_b0,
               (gc_heap_ptr<mjs::gc_string> *)(local_d0 + 0x10),1);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_d0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_d0 + 0x10));
    local_f0._0_8_ = local_e0.heap_;
    local_f0._8_4_ = local_e0.pos_;
    if (local_e0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_e0.heap_,(gc_heap_ptr_untyped *)local_f0);
    }
    local_80._0_4_ = object;
    local_78.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
         (gc_heap *)local_f0._0_8_;
    local_78.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_f0._8_4_;
    if ((gc_heap *)local_f0._0_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_f0._0_8_,(gc_heap_ptr_untyped *)(local_80 + 8));
    }
    (**(code **)(*plVar2 + 8))(plVar2,&local_b0,local_80,2);
    value::destroy((value *)local_80);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_e0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_b0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_90);
  }
  pvVar4 = gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  if (1 < *(int *)((long)pvVar4 + 0x20)) {
    local_90.heap_ = local_58.heap_;
    local_90.pos_ = local_58.pos_;
    if ((slot *)local_58.heap_ != (slot *)0x0) {
      gc_heap::attach(local_58.heap_,&local_90);
    }
    local_a0.heap_ = (global->super_gc_heap_ptr_untyped).heap_;
    local_a0.pos_ = (global->super_gc_heap_ptr_untyped).pos_;
    if (local_a0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_a0.heap_,&local_a0);
    }
    local_48._M_len = 0xe;
    local_48._M_str = "getPrototypeOf";
    string::string((string *)&local_b0,(global->super_gc_heap_ptr_untyped).heap_,&local_48);
    plVar2 = (long *)gc_heap_ptr_untyped::get(&local_90);
    make_raw_function((mjs *)&local_e0,global);
    pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_e0);
    local_d0._16_8_ = (slot *)0x0;
    local_b8 = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_d0,(size_t)(pfVar3->super_native_object).super_object.heap_);
    pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_d0);
    *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001d4b28;
    *(gc_heap **)((long)pvVar4 + 0x10) = local_a0.heap_;
    *(uint32_t *)((long)pvVar4 + 0x18) = local_a0.pos_;
    if (local_a0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_a0.heap_,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x10));
    }
    function_object::put_function
              (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_d0,
               (gc_heap_ptr<mjs::gc_string> *)&local_b0,
               (gc_heap_ptr<mjs::gc_string> *)(local_d0 + 0x10),1);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_d0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_d0 + 0x10));
    local_f0._0_8_ = local_e0.heap_;
    local_f0._8_4_ = local_e0.pos_;
    if (local_e0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_e0.heap_,(gc_heap_ptr_untyped *)local_f0);
    }
    local_80._0_4_ = object;
    local_78.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
         (gc_heap *)local_f0._0_8_;
    local_78.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_f0._8_4_;
    if ((gc_heap *)local_f0._0_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_f0._0_8_,(gc_heap_ptr_untyped *)(local_80 + 8));
    }
    (**(code **)(*plVar2 + 8))(plVar2,&local_b0,local_80,2);
    value::destroy((value *)local_80);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_e0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_b0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_a0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_90);
    local_90.heap_ = (global->super_gc_heap_ptr_untyped).heap_;
    local_90.pos_ = (global->super_gc_heap_ptr_untyped).pos_;
    if (local_90.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_90.heap_,&local_90);
    }
    local_48._M_len = 0xd;
    local_48._M_str = "isPrototypeOf";
    string::string((string *)&local_b0,(global->super_gc_heap_ptr_untyped).heap_,&local_48);
    plVar2 = (long *)gc_heap_ptr_untyped::get(&local_38);
    make_raw_function((mjs *)&local_e0,global);
    pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_e0);
    local_d0._16_8_ = (slot *)0x0;
    local_b8 = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_d0,(size_t)(pfVar3->super_native_object).super_object.heap_);
    pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_d0);
    *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001d4b68;
    *(gc_heap **)((long)pvVar4 + 0x10) = local_90.heap_;
    *(uint32_t *)((long)pvVar4 + 0x18) = local_90.pos_;
    if (local_90.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_90.heap_,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x10));
    }
    function_object::put_function
              (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_d0,
               (gc_heap_ptr<mjs::gc_string> *)&local_b0,
               (gc_heap_ptr<mjs::gc_string> *)(local_d0 + 0x10),1);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_d0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_d0 + 0x10));
    local_f0._0_8_ = local_e0.heap_;
    local_f0._8_4_ = local_e0.pos_;
    if (local_e0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_e0.heap_,(gc_heap_ptr_untyped *)local_f0);
    }
    local_80._0_4_ = object;
    local_78.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
         (gc_heap *)local_f0._0_8_;
    local_78.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_f0._8_4_;
    if ((gc_heap *)local_f0._0_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_f0._0_8_,(gc_heap_ptr_untyped *)(local_80 + 8));
    }
    (**(code **)(*plVar2 + 8))(plVar2,&local_b0,local_80,2);
    value::destroy((value *)local_80);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_e0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_b0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_90);
    local_90.heap_ = local_58.heap_;
    local_90.pos_ = local_58.pos_;
    if ((slot *)local_58.heap_ != (slot *)0x0) {
      gc_heap::attach(local_58.heap_,&local_90);
    }
    local_a0.heap_ = (global->super_gc_heap_ptr_untyped).heap_;
    local_a0.pos_ = (global->super_gc_heap_ptr_untyped).pos_;
    if (local_a0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_a0.heap_,&local_a0);
    }
    local_48._M_len = 0x13;
    local_48._M_str = "getOwnPropertyNames";
    string::string((string *)&local_b0,(global->super_gc_heap_ptr_untyped).heap_,&local_48);
    plVar2 = (long *)gc_heap_ptr_untyped::get(&local_90);
    make_raw_function((mjs *)&local_e0,global);
    pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_e0);
    local_d0._16_8_ = (slot *)0x0;
    local_b8 = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_d0,(size_t)(pfVar3->super_native_object).super_object.heap_);
    pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_d0);
    *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001d4ba8;
    *(gc_heap **)((long)pvVar4 + 0x10) = local_a0.heap_;
    *(uint32_t *)((long)pvVar4 + 0x18) = local_a0.pos_;
    if (local_a0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_a0.heap_,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x10));
    }
    function_object::put_function
              (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_d0,
               (gc_heap_ptr<mjs::gc_string> *)&local_b0,
               (gc_heap_ptr<mjs::gc_string> *)(local_d0 + 0x10),1);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_d0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_d0 + 0x10));
    local_f0._0_8_ = local_e0.heap_;
    local_f0._8_4_ = local_e0.pos_;
    if (local_e0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_e0.heap_,(gc_heap_ptr_untyped *)local_f0);
    }
    local_80._0_4_ = object;
    local_78.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
         (gc_heap *)local_f0._0_8_;
    local_78.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_f0._8_4_;
    if ((gc_heap *)local_f0._0_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_f0._0_8_,(gc_heap_ptr_untyped *)(local_80 + 8));
    }
    (**(code **)(*plVar2 + 8))(plVar2,&local_b0,local_80,2);
    value::destroy((value *)local_80);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_e0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_b0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_a0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_90);
    local_90.heap_ = local_58.heap_;
    local_90.pos_ = local_58.pos_;
    if ((slot *)local_58.heap_ != (slot *)0x0) {
      gc_heap::attach(local_58.heap_,&local_90);
    }
    local_a0.heap_ = (global->super_gc_heap_ptr_untyped).heap_;
    local_a0.pos_ = (global->super_gc_heap_ptr_untyped).pos_;
    if (local_a0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_a0.heap_,&local_a0);
    }
    local_48._M_len = 4;
    local_48._M_str = "keys";
    string::string((string *)&local_b0,(global->super_gc_heap_ptr_untyped).heap_,&local_48);
    plVar2 = (long *)gc_heap_ptr_untyped::get(&local_90);
    make_raw_function((mjs *)&local_e0,global);
    pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_e0);
    local_d0._16_8_ = (slot *)0x0;
    local_b8 = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_d0,(size_t)(pfVar3->super_native_object).super_object.heap_);
    pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_d0);
    *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001d4be8;
    *(gc_heap **)((long)pvVar4 + 0x10) = local_a0.heap_;
    *(uint32_t *)((long)pvVar4 + 0x18) = local_a0.pos_;
    if (local_a0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_a0.heap_,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x10));
    }
    function_object::put_function
              (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_d0,
               (gc_heap_ptr<mjs::gc_string> *)&local_b0,
               (gc_heap_ptr<mjs::gc_string> *)(local_d0 + 0x10),1);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_d0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_d0 + 0x10));
    local_f0._0_8_ = local_e0.heap_;
    local_f0._8_4_ = local_e0.pos_;
    if (local_e0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_e0.heap_,(gc_heap_ptr_untyped *)local_f0);
    }
    local_80._0_4_ = object;
    local_78.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
         (gc_heap *)local_f0._0_8_;
    local_78.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_f0._8_4_;
    if ((gc_heap *)local_f0._0_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_f0._0_8_,(gc_heap_ptr_untyped *)(local_80 + 8));
    }
    (**(code **)(*plVar2 + 8))(plVar2,&local_b0,local_80,2);
    value::destroy((value *)local_80);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_e0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_b0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_a0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_90);
    local_90.heap_ = local_58.heap_;
    local_90.pos_ = local_58.pos_;
    if ((slot *)local_58.heap_ != (slot *)0x0) {
      gc_heap::attach(local_58.heap_,&local_90);
    }
    local_a0.heap_ = (global->super_gc_heap_ptr_untyped).heap_;
    local_a0.pos_ = (global->super_gc_heap_ptr_untyped).pos_;
    if (local_a0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_a0.heap_,&local_a0);
    }
    local_48._M_len = 0x18;
    local_48._M_str = "getOwnPropertyDescriptor";
    string::string((string *)&local_b0,(global->super_gc_heap_ptr_untyped).heap_,&local_48);
    plVar2 = (long *)gc_heap_ptr_untyped::get(&local_90);
    make_raw_function((mjs *)&local_e0,global);
    pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_e0);
    local_d0._16_8_ = (slot *)0x0;
    local_b8 = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_d0,(size_t)(pfVar3->super_native_object).super_object.heap_);
    pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_d0);
    *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001d4c28;
    *(gc_heap **)((long)pvVar4 + 0x10) = local_a0.heap_;
    *(uint32_t *)((long)pvVar4 + 0x18) = local_a0.pos_;
    if (local_a0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_a0.heap_,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x10));
    }
    function_object::put_function
              (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_d0,
               (gc_heap_ptr<mjs::gc_string> *)&local_b0,
               (gc_heap_ptr<mjs::gc_string> *)(local_d0 + 0x10),2);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_d0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_d0 + 0x10));
    local_f0._0_8_ = local_e0.heap_;
    local_f0._8_4_ = local_e0.pos_;
    if (local_e0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_e0.heap_,(gc_heap_ptr_untyped *)local_f0);
    }
    local_80._0_4_ = object;
    local_78.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
         (gc_heap *)local_f0._0_8_;
    local_78.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_f0._8_4_;
    if ((gc_heap *)local_f0._0_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_f0._0_8_,(gc_heap_ptr_untyped *)(local_80 + 8));
    }
    (**(code **)(*plVar2 + 8))(plVar2,&local_b0,local_80,2);
    value::destroy((value *)local_80);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_e0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_b0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_a0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_90);
    local_90.heap_ = local_58.heap_;
    local_90.pos_ = local_58.pos_;
    if ((slot *)local_58.heap_ != (slot *)0x0) {
      gc_heap::attach(local_58.heap_,&local_90);
    }
    local_a0.heap_ = (global->super_gc_heap_ptr_untyped).heap_;
    local_a0.pos_ = (global->super_gc_heap_ptr_untyped).pos_;
    if (local_a0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_a0.heap_,&local_a0);
    }
    local_48._M_len = 0xe;
    local_48._M_str = "defineProperty";
    string::string((string *)&local_b0,(global->super_gc_heap_ptr_untyped).heap_,&local_48);
    plVar2 = (long *)gc_heap_ptr_untyped::get(&local_90);
    make_raw_function((mjs *)&local_e0,global);
    pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_e0);
    local_d0._16_8_ = (slot *)0x0;
    local_b8 = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_d0,(size_t)(pfVar3->super_native_object).super_object.heap_);
    pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_d0);
    *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001d4c68;
    *(gc_heap **)((long)pvVar4 + 0x10) = local_a0.heap_;
    *(uint32_t *)((long)pvVar4 + 0x18) = local_a0.pos_;
    if (local_a0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_a0.heap_,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x10));
    }
    function_object::put_function
              (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_d0,
               (gc_heap_ptr<mjs::gc_string> *)&local_b0,
               (gc_heap_ptr<mjs::gc_string> *)(local_d0 + 0x10),3);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_d0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_d0 + 0x10));
    local_f0._0_8_ = local_e0.heap_;
    local_f0._8_4_ = local_e0.pos_;
    if (local_e0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_e0.heap_,(gc_heap_ptr_untyped *)local_f0);
    }
    local_80._0_4_ = object;
    local_78.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
         (gc_heap *)local_f0._0_8_;
    local_78.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_f0._8_4_;
    if ((gc_heap *)local_f0._0_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_f0._0_8_,(gc_heap_ptr_untyped *)(local_80 + 8));
    }
    (**(code **)(*plVar2 + 8))(plVar2,&local_b0,local_80,2);
    value::destroy((value *)local_80);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_e0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_b0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_a0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_90);
    local_90.heap_ = local_58.heap_;
    local_90.pos_ = local_58.pos_;
    if ((slot *)local_58.heap_ != (slot *)0x0) {
      gc_heap::attach(local_58.heap_,&local_90);
    }
    local_a0.heap_ = (global->super_gc_heap_ptr_untyped).heap_;
    local_a0.pos_ = (global->super_gc_heap_ptr_untyped).pos_;
    if (local_a0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_a0.heap_,&local_a0);
    }
    local_48._M_len = 0x10;
    local_48._M_str = "defineProperties";
    string::string((string *)&local_b0,(global->super_gc_heap_ptr_untyped).heap_,&local_48);
    plVar2 = (long *)gc_heap_ptr_untyped::get(&local_90);
    make_raw_function((mjs *)&local_e0,global);
    pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_e0);
    local_d0._16_8_ = (slot *)0x0;
    local_b8 = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_d0,(size_t)(pfVar3->super_native_object).super_object.heap_);
    pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_d0);
    *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001d4ca8;
    *(gc_heap **)((long)pvVar4 + 0x10) = local_a0.heap_;
    *(uint32_t *)((long)pvVar4 + 0x18) = local_a0.pos_;
    if (local_a0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_a0.heap_,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x10));
    }
    function_object::put_function
              (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_d0,
               (gc_heap_ptr<mjs::gc_string> *)&local_b0,
               (gc_heap_ptr<mjs::gc_string> *)(local_d0 + 0x10),2);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_d0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_d0 + 0x10));
    local_f0._0_8_ = local_e0.heap_;
    local_f0._8_4_ = local_e0.pos_;
    if (local_e0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_e0.heap_,(gc_heap_ptr_untyped *)local_f0);
    }
    local_80._0_4_ = object;
    local_78.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
         (gc_heap *)local_f0._0_8_;
    local_78.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_f0._8_4_;
    if ((gc_heap *)local_f0._0_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_f0._0_8_,(gc_heap_ptr_untyped *)(local_80 + 8));
    }
    (**(code **)(*plVar2 + 8))(plVar2,&local_b0,local_80,2);
    value::destroy((value *)local_80);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_e0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_b0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_a0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_90);
    local_90.heap_ = local_58.heap_;
    local_90.pos_ = local_58.pos_;
    if ((slot *)local_58.heap_ != (slot *)0x0) {
      gc_heap::attach(local_58.heap_,&local_90);
    }
    local_a0.heap_ = (global->super_gc_heap_ptr_untyped).heap_;
    local_a0.pos_ = (global->super_gc_heap_ptr_untyped).pos_;
    if (local_a0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_a0.heap_,&local_a0);
    }
    local_48._M_len = 0xc;
    local_48._M_str = "isExtensible";
    string::string((string *)&local_b0,(global->super_gc_heap_ptr_untyped).heap_,&local_48);
    plVar2 = (long *)gc_heap_ptr_untyped::get(&local_90);
    make_raw_function((mjs *)&local_e0,global);
    pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_e0);
    local_d0._16_8_ = (slot *)0x0;
    local_b8 = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_d0,(size_t)(pfVar3->super_native_object).super_object.heap_);
    pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_d0);
    *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001d4ce8;
    *(gc_heap **)((long)pvVar4 + 0x10) = local_a0.heap_;
    *(uint32_t *)((long)pvVar4 + 0x18) = local_a0.pos_;
    if (local_a0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_a0.heap_,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x10));
    }
    function_object::put_function
              (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_d0,
               (gc_heap_ptr<mjs::gc_string> *)&local_b0,
               (gc_heap_ptr<mjs::gc_string> *)(local_d0 + 0x10),1);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_d0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_d0 + 0x10));
    local_f0._0_8_ = local_e0.heap_;
    local_f0._8_4_ = local_e0.pos_;
    if (local_e0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_e0.heap_,(gc_heap_ptr_untyped *)local_f0);
    }
    local_80._0_4_ = object;
    local_78.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
         (gc_heap *)local_f0._0_8_;
    local_78.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_f0._8_4_;
    if ((gc_heap *)local_f0._0_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_f0._0_8_,(gc_heap_ptr_untyped *)(local_80 + 8));
    }
    (**(code **)(*plVar2 + 8))(plVar2,&local_b0,local_80,2);
    value::destroy((value *)local_80);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_e0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_b0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_a0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_90);
    local_90.heap_ = local_58.heap_;
    local_90.pos_ = local_58.pos_;
    if ((slot *)local_58.heap_ != (slot *)0x0) {
      gc_heap::attach(local_58.heap_,&local_90);
    }
    local_a0.heap_ = (global->super_gc_heap_ptr_untyped).heap_;
    local_a0.pos_ = (global->super_gc_heap_ptr_untyped).pos_;
    if (local_a0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_a0.heap_,&local_a0);
    }
    local_48._M_len = 0x11;
    local_48._M_str = "preventExtensions";
    string::string((string *)&local_b0,(global->super_gc_heap_ptr_untyped).heap_,&local_48);
    plVar2 = (long *)gc_heap_ptr_untyped::get(&local_90);
    make_raw_function((mjs *)&local_e0,global);
    pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_e0);
    local_d0._16_8_ = (slot *)0x0;
    local_b8 = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_d0,(size_t)(pfVar3->super_native_object).super_object.heap_);
    pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_d0);
    *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001d4d28;
    *(gc_heap **)((long)pvVar4 + 0x10) = local_a0.heap_;
    *(uint32_t *)((long)pvVar4 + 0x18) = local_a0.pos_;
    if (local_a0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_a0.heap_,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x10));
    }
    function_object::put_function
              (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_d0,
               (gc_heap_ptr<mjs::gc_string> *)&local_b0,
               (gc_heap_ptr<mjs::gc_string> *)(local_d0 + 0x10),1);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_d0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_d0 + 0x10));
    local_f0._0_8_ = local_e0.heap_;
    local_f0._8_4_ = local_e0.pos_;
    if (local_e0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_e0.heap_,(gc_heap_ptr_untyped *)local_f0);
    }
    local_80._0_4_ = object;
    local_78.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
         (gc_heap *)local_f0._0_8_;
    local_78.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_f0._8_4_;
    if ((gc_heap *)local_f0._0_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_f0._0_8_,(gc_heap_ptr_untyped *)(local_80 + 8));
    }
    (**(code **)(*plVar2 + 8))(plVar2,&local_b0,local_80,2);
    value::destroy((value *)local_80);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_e0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_b0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_a0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_90);
    local_90.heap_ = local_58.heap_;
    local_90.pos_ = local_58.pos_;
    if ((slot *)local_58.heap_ != (slot *)0x0) {
      gc_heap::attach(local_58.heap_,&local_90);
    }
    local_a0.heap_ = (global->super_gc_heap_ptr_untyped).heap_;
    local_a0.pos_ = (global->super_gc_heap_ptr_untyped).pos_;
    if (local_a0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_a0.heap_,&local_a0);
    }
    local_48._M_len = 8;
    local_48._M_str = "isSealed";
    string::string((string *)&local_b0,(global->super_gc_heap_ptr_untyped).heap_,&local_48);
    plVar2 = (long *)gc_heap_ptr_untyped::get(&local_90);
    make_raw_function((mjs *)&local_e0,global);
    pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_e0);
    local_d0._16_8_ = (slot *)0x0;
    local_b8 = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_d0,(size_t)(pfVar3->super_native_object).super_object.heap_);
    pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_d0);
    *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001d4d68;
    *(gc_heap **)((long)pvVar4 + 0x10) = local_a0.heap_;
    *(uint32_t *)((long)pvVar4 + 0x18) = local_a0.pos_;
    if (local_a0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_a0.heap_,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x10));
    }
    function_object::put_function
              (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_d0,
               (gc_heap_ptr<mjs::gc_string> *)&local_b0,
               (gc_heap_ptr<mjs::gc_string> *)(local_d0 + 0x10),1);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_d0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_d0 + 0x10));
    local_f0._0_8_ = local_e0.heap_;
    local_f0._8_4_ = local_e0.pos_;
    if (local_e0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_e0.heap_,(gc_heap_ptr_untyped *)local_f0);
    }
    local_80._0_4_ = object;
    local_78.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
         (gc_heap *)local_f0._0_8_;
    local_78.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_f0._8_4_;
    if ((gc_heap *)local_f0._0_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_f0._0_8_,(gc_heap_ptr_untyped *)(local_80 + 8));
    }
    (**(code **)(*plVar2 + 8))(plVar2,&local_b0,local_80,2);
    value::destroy((value *)local_80);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_e0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_b0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_a0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_90);
    local_90.heap_ = local_58.heap_;
    local_90.pos_ = local_58.pos_;
    if ((slot *)local_58.heap_ != (slot *)0x0) {
      gc_heap::attach(local_58.heap_,&local_90);
    }
    local_a0.heap_ = (global->super_gc_heap_ptr_untyped).heap_;
    local_a0.pos_ = (global->super_gc_heap_ptr_untyped).pos_;
    if (local_a0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_a0.heap_,&local_a0);
    }
    local_48._M_len = 4;
    local_48._M_str = "seal";
    string::string((string *)&local_b0,(global->super_gc_heap_ptr_untyped).heap_,&local_48);
    plVar2 = (long *)gc_heap_ptr_untyped::get(&local_90);
    make_raw_function((mjs *)&local_e0,global);
    pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_e0);
    local_d0._16_8_ = (slot *)0x0;
    local_b8 = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_d0,(size_t)(pfVar3->super_native_object).super_object.heap_);
    pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_d0);
    *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001d4da8;
    *(gc_heap **)((long)pvVar4 + 0x10) = local_a0.heap_;
    *(uint32_t *)((long)pvVar4 + 0x18) = local_a0.pos_;
    if (local_a0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_a0.heap_,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x10));
    }
    function_object::put_function
              (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_d0,
               (gc_heap_ptr<mjs::gc_string> *)&local_b0,
               (gc_heap_ptr<mjs::gc_string> *)(local_d0 + 0x10),1);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_d0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_d0 + 0x10));
    local_f0._0_8_ = local_e0.heap_;
    local_f0._8_4_ = local_e0.pos_;
    if (local_e0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_e0.heap_,(gc_heap_ptr_untyped *)local_f0);
    }
    local_80._0_4_ = object;
    local_78.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
         (gc_heap *)local_f0._0_8_;
    local_78.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_f0._8_4_;
    if ((gc_heap *)local_f0._0_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_f0._0_8_,(gc_heap_ptr_untyped *)(local_80 + 8));
    }
    (**(code **)(*plVar2 + 8))(plVar2,&local_b0,local_80,2);
    value::destroy((value *)local_80);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_e0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_b0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_a0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_90);
    local_90.heap_ = local_58.heap_;
    local_90.pos_ = local_58.pos_;
    if ((slot *)local_58.heap_ != (slot *)0x0) {
      gc_heap::attach(local_58.heap_,&local_90);
    }
    local_a0.heap_ = (global->super_gc_heap_ptr_untyped).heap_;
    local_a0.pos_ = (global->super_gc_heap_ptr_untyped).pos_;
    if (local_a0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_a0.heap_,&local_a0);
    }
    local_48._M_len = 8;
    local_48._M_str = "isFrozen";
    string::string((string *)&local_b0,(global->super_gc_heap_ptr_untyped).heap_,&local_48);
    plVar2 = (long *)gc_heap_ptr_untyped::get(&local_90);
    make_raw_function((mjs *)&local_e0,global);
    pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_e0);
    local_d0._16_8_ = (slot *)0x0;
    local_b8 = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_d0,(size_t)(pfVar3->super_native_object).super_object.heap_);
    pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_d0);
    *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001d4de8;
    *(gc_heap **)((long)pvVar4 + 0x10) = local_a0.heap_;
    *(uint32_t *)((long)pvVar4 + 0x18) = local_a0.pos_;
    if (local_a0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_a0.heap_,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x10));
    }
    function_object::put_function
              (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_d0,
               (gc_heap_ptr<mjs::gc_string> *)&local_b0,
               (gc_heap_ptr<mjs::gc_string> *)(local_d0 + 0x10),1);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_d0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_d0 + 0x10));
    local_f0._0_8_ = local_e0.heap_;
    local_f0._8_4_ = local_e0.pos_;
    if (local_e0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_e0.heap_,(gc_heap_ptr_untyped *)local_f0);
    }
    local_80._0_4_ = object;
    local_78.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
         (gc_heap *)local_f0._0_8_;
    local_78.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_f0._8_4_;
    if ((gc_heap *)local_f0._0_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_f0._0_8_,(gc_heap_ptr_untyped *)(local_80 + 8));
    }
    (**(code **)(*plVar2 + 8))(plVar2,&local_b0,local_80,2);
    value::destroy((value *)local_80);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_e0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_b0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_a0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_90);
    local_90.heap_ = local_58.heap_;
    local_90.pos_ = local_58.pos_;
    if ((slot *)local_58.heap_ != (slot *)0x0) {
      gc_heap::attach(local_58.heap_,&local_90);
    }
    local_a0.heap_ = (global->super_gc_heap_ptr_untyped).heap_;
    local_a0.pos_ = (global->super_gc_heap_ptr_untyped).pos_;
    if (local_a0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_a0.heap_,&local_a0);
    }
    local_48._M_len = 6;
    local_48._M_str = "freeze";
    string::string((string *)&local_b0,(global->super_gc_heap_ptr_untyped).heap_,&local_48);
    plVar2 = (long *)gc_heap_ptr_untyped::get(&local_90);
    make_raw_function((mjs *)&local_e0,global);
    pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_e0);
    local_d0._16_8_ = (slot *)0x0;
    local_b8 = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_d0,(size_t)(pfVar3->super_native_object).super_object.heap_);
    pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_d0);
    *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001d4e28;
    *(gc_heap **)((long)pvVar4 + 0x10) = local_a0.heap_;
    *(uint32_t *)((long)pvVar4 + 0x18) = local_a0.pos_;
    if (local_a0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_a0.heap_,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x10));
    }
    function_object::put_function
              (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_d0,
               (gc_heap_ptr<mjs::gc_string> *)&local_b0,
               (gc_heap_ptr<mjs::gc_string> *)(local_d0 + 0x10),1);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_d0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_d0 + 0x10));
    local_f0._0_8_ = local_e0.heap_;
    local_f0._8_4_ = local_e0.pos_;
    if (local_e0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_e0.heap_,(gc_heap_ptr_untyped *)local_f0);
    }
    local_80._0_4_ = object;
    local_78.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
         (gc_heap *)local_f0._0_8_;
    local_78.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_f0._8_4_;
    if ((gc_heap *)local_f0._0_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_f0._0_8_,(gc_heap_ptr_untyped *)(local_80 + 8));
    }
    (**(code **)(*plVar2 + 8))(plVar2,&local_b0,local_80,2);
    value::destroy((value *)local_80);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_e0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_b0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_a0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_90);
    local_90.heap_ = local_58.heap_;
    local_90.pos_ = local_58.pos_;
    if ((slot *)local_58.heap_ != (slot *)0x0) {
      gc_heap::attach(local_58.heap_,&local_90);
    }
    local_a0.heap_ = (global->super_gc_heap_ptr_untyped).heap_;
    local_a0.pos_ = (global->super_gc_heap_ptr_untyped).pos_;
    if (local_a0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_a0.heap_,&local_a0);
    }
    local_48._M_len = 6;
    local_48._M_str = "create";
    string::string((string *)&local_b0,(global->super_gc_heap_ptr_untyped).heap_,&local_48);
    plVar2 = (long *)gc_heap_ptr_untyped::get(&local_90);
    make_raw_function((mjs *)&local_e0,global);
    pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_e0);
    local_d0._16_8_ = (slot *)0x0;
    local_b8 = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_d0,(size_t)(pfVar3->super_native_object).super_object.heap_);
    pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_d0);
    *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001d4e68;
    *(gc_heap **)((long)pvVar4 + 0x10) = local_a0.heap_;
    *(uint32_t *)((long)pvVar4 + 0x18) = local_a0.pos_;
    if (local_a0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_a0.heap_,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x10));
    }
    function_object::put_function
              (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_d0,
               (gc_heap_ptr<mjs::gc_string> *)&local_b0,
               (gc_heap_ptr<mjs::gc_string> *)(local_d0 + 0x10),2);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_d0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_d0 + 0x10));
    local_f0._0_8_ = local_e0.heap_;
    local_f0._8_4_ = local_e0.pos_;
    if (local_e0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_e0.heap_,(gc_heap_ptr_untyped *)local_f0);
    }
    local_80._0_4_ = object;
    local_78.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
         (gc_heap *)local_f0._0_8_;
    local_78.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_f0._8_4_;
    if ((gc_heap *)local_f0._0_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_f0._0_8_,(gc_heap_ptr_untyped *)(local_80 + 8));
    }
    (**(code **)(*plVar2 + 8))(plVar2,&local_b0,local_80,2);
    value::destroy((value *)local_80);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_e0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_b0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_a0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_90);
  }
  (__return_storage_ptr__->obj).super_gc_heap_ptr_untyped.heap_ = local_58.heap_;
  (__return_storage_ptr__->obj).super_gc_heap_ptr_untyped.pos_ = local_58.pos_;
  if ((slot *)local_58.heap_ != (slot *)0x0) {
    gc_heap::attach(local_58.heap_,(gc_heap_ptr_untyped *)__return_storage_ptr__);
  }
  (__return_storage_ptr__->prototype).super_gc_heap_ptr_untyped.heap_ = local_38.heap_;
  (__return_storage_ptr__->prototype).super_gc_heap_ptr_untyped.pos_ = local_38.pos_;
  if (local_38.heap_ != (gc_heap *)0x0) {
    gc_heap::attach(local_38.heap_,&(__return_storage_ptr__->prototype).super_gc_heap_ptr_untyped);
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_58);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_38);
  return __return_storage_ptr__;
}

Assistant:

global_object_create_result make_object_object(const gc_heap_ptr<global_object>& global) {
    auto prototype = global->object_prototype();
    auto o = make_function(global, [global](const value&, const std::vector<value>& args) {
        if (args.empty() || args.front().type() == value_type::undefined || args.front().type() == value_type::null) {
            return value{global->make_object()};
        }
        return value{global->to_object(args.front())};
    }, prototype->class_name().unsafe_raw_get(), 1);
    o->default_construct_function();

    // �15.2.4
    prototype->put(global->common_string("constructor"), value{o}, global_object::default_attributes);

    auto& h = global->heap();
    put_native_function(global, prototype, "toString", [&h](const value& this_, const std::vector<value>&){
        return value{string{h, "[object "} + this_.object_value()->class_name() + string{h, "]"}};
    }, 0);
    put_native_function(global, prototype, "valueOf", [](const value& this_, const std::vector<value>&){
        return this_;
    }, 0);

    if (global->language_version() >= version::es3) {
        put_native_function(global, prototype, "toLocaleString", [global](const value& this_, const std::vector<value>&) {
            auto o = global->to_object(this_);
            return call_function(o->get(L"toString"), value{o}, {});
        }, 0);
        put_native_function(global, prototype, "hasOwnProperty", [global](const value& this_, const std::vector<value>& args) {
            auto o = global->validate_object(this_);
            return value{has_own_property(o, to_string(o.heap(), get_arg(args, 0)).view())};
        }, 1);
        put_native_function(global, prototype, "propertyIsEnumerable", [global](const value& this_, const std::vector<value>& args) {
            auto o = global->validate_object(this_);
            const auto a = o->own_property_attributes(to_string(o.heap(), get_arg(args, 0)).view());
            return value{is_valid(a) && (a & property_attribute::dont_enum) == property_attribute::none};
        }, 1);
    }

    if (global->language_version() >= version::es5) {
        put_native_function(global, o, "getPrototypeOf", [global](const value&, const std::vector<value>& args) {
            auto o = global->validate_object(get_arg(args, 0));
            auto p = o->prototype();
            return p ? value{p} : value::null;
        }, 1);

        put_native_function(global, prototype, "isPrototypeOf", [global](const value& this_, const std::vector<value>& args) {
            if (!args.empty() && args[0].type() == value_type::object) {
                auto v = args[0].object_value()->prototype();
                auto o = global->to_object(this_);
                while (v) {
                    if (o.get() == v.get()) {
                        return value{true};
                    }
                    v = v->prototype();
                }
            }
            return value{false};
        }, 1);

        put_native_function(global, o, "getOwnPropertyNames", [global](const value&, const std::vector<value>& args) {
            return get_property_names(global, get_arg(args, 0), false);
        }, 1);

        put_native_function(global, o, "keys", [global](const value&, const std::vector<value>& args) {
            return get_property_names(global, get_arg(args, 0), true);
        }, 1);

        put_native_function(global, o, "getOwnPropertyDescriptor", [global](const value&, const std::vector<value>& args) {
            auto o = global->validate_object(get_arg(args, 0));
            auto& h = global->heap();
            auto p = to_string(h, get_arg(args, 1));
            const auto a = o->own_property_attributes(p.view());
            if (!is_valid(a)) {
                // Seems like we have to return undefined in ES5.1 (15.10.4)
                return value::undefined;
            }
            auto desc = global->make_object();
            if (has_attributes(a, property_attribute::accessor)) {
                copy_accessor_methods(desc, o->get_accessor_property_object(p.view()));
            } else {
                desc->put(global->common_string("value"), o->get(p.view()));
                desc->put(global->common_string("writable"), value{(a & property_attribute::read_only) == property_attribute::none});
            }
            desc->put(global->common_string("enumerable"), value{(a & property_attribute::dont_enum) == property_attribute::none});
            desc->put(global->common_string("configurable"), value{(a & property_attribute::dont_delete) == property_attribute::none});

            return value{desc};
        }, 2);

        put_native_function(global, o, "defineProperty", [global](const value&, const std::vector<value>& args) {
            auto& h = global->heap();
            auto o = global->validate_object(get_arg(args, 0));
            auto p = to_string(h, get_arg(args, 1));
            define_own_property_checked(global, o, p, get_arg(args, 2));
            return value{o};
        }, 3);

        put_native_function(global, o, "defineProperties", [global](const value&, const std::vector<value>& args) {
            auto o = global->validate_object(get_arg(args, 0));
            auto props = global->to_object(get_arg(args, 1));
            for (const auto& p : props->own_property_names(false)) {
                define_own_property_checked(global, o, p, props->get(p.view()));
            }
            return value{o};
        }, 2);

        put_native_function(global, o, "isExtensible", [global](const value&, const std::vector<value>& args) {
            return value{global->validate_object(get_arg(args, 0))->is_extensible()};
        }, 1);

        put_native_function(global, o, "preventExtensions", [global](const value&, const std::vector<value>& args) {
            auto o = global->validate_object(get_arg(args, 0));
            o->prevent_extensions();
            return value{o};
        }, 1);

        put_native_function(global, o, "isSealed", [global](const value&, const std::vector<value>& args) {
            return value{check_for_immutability(global->validate_object(get_arg(args, 0)), property_attribute::dont_delete)};
        }, 1);

        put_native_function(global, o, "seal", [global](const value&, const std::vector<value>& args) {
            auto o = global->validate_object(get_arg(args, 0));
            make_immutable(o, property_attribute::dont_delete);
            return value{o};
        }, 1);

        put_native_function(global, o, "isFrozen", [global](const value&, const std::vector<value>& args) {
            return value{check_for_immutability(global->validate_object(get_arg(args, 0)), property_attribute::read_only | property_attribute::dont_delete)};
        }, 1);

        put_native_function(global, o, "freeze", [global](const value&, const std::vector<value>& args) {
            auto o = global->validate_object(get_arg(args, 0));
            make_immutable(o, property_attribute::read_only | property_attribute::dont_delete);
            return value{o};
        }, 1);

        put_native_function(global, o, "create", [global](const value&, const std::vector<value>& args) {
            if (args.empty() || (args[0].type() != value_type::null && args[0].type() != value_type::object)) {
                throw native_error_exception{native_error_type::type, global->stack_trace(), L"Invalid object prototype"};
            }
            auto o = global->heap().make<object>(global->object_prototype()->class_name(), args[0].type() == value_type::object ? args[0].object_value() : nullptr);
            if (args.size() > 1) {
                auto props = global->to_object(args[1]);
                for (const auto& p : props->own_property_names(false)) {
                    define_own_property_checked(global, o, p, props->get(p.view()));
                }
            }
            return value{o};
        }, 2);
    }

    return { o, prototype };
}